

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDynamicLoader.cxx
# Opt level: O0

void __thiscall cmDynamicLoaderCache::FlushCache(cmDynamicLoaderCache *this)

{
  cmDynamicLoaderCache *pcVar1;
  bool bVar2;
  pointer ppVar3;
  _Self local_20;
  _Self local_18;
  iterator it;
  cmDynamicLoaderCache *this_local;
  
  it._M_node = (_Base_ptr)this;
  local_18._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>_>_>
       ::begin(&this->CacheMap);
  while( true ) {
    local_20._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>_>_>
         ::end(&this->CacheMap);
    bVar2 = std::operator!=(&local_18,&local_20);
    pcVar1 = Instance;
    if (!bVar2) break;
    ppVar3 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>_>
             ::operator->(&local_18);
    cmsys::DynamicLoader::CloseLibrary(ppVar3->second);
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>_>
    ::operator++(&local_18,0);
  }
  if (Instance != (cmDynamicLoaderCache *)0x0) {
    ~cmDynamicLoaderCache(Instance);
    operator_delete(pcVar1,0x30);
  }
  Instance = (cmDynamicLoaderCache *)0x0;
  return;
}

Assistant:

void cmDynamicLoaderCache::FlushCache()
{
  for (std::map<std::string, cmsys::DynamicLoader::LibraryHandle>::iterator
         it = this->CacheMap.begin();
       it != this->CacheMap.end(); it++) {
    cmsys::DynamicLoader::CloseLibrary(it->second);
  }
  delete cmDynamicLoaderCache::Instance;
  cmDynamicLoaderCache::Instance = CM_NULLPTR;
}